

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O3

RK_S32 __thiscall mpp_list::flush(mpp_list *this)

{
  RK_S32 *pRVar1;
  int iVar2;
  mpp_list_node *__ptr;
  mpp_list_node *pmVar3;
  mpp_list_node *pmVar4;
  
  if (this->head != (mpp_list_node *)0x0) {
    iVar2 = this->count;
    while (iVar2 != 0) {
      __ptr = this->head->next;
      pmVar3 = __ptr->prev;
      pmVar4 = __ptr->next;
      pmVar4->prev = pmVar3;
      pmVar3->next = pmVar4;
      __ptr->next = __ptr;
      __ptr->prev = __ptr;
      if (this->destroy != (node_destructor)0x0) {
        (*this->destroy)(__ptr + 1);
      }
      free(__ptr);
      pRVar1 = &this->count;
      *pRVar1 = *pRVar1 + -1;
      iVar2 = *pRVar1;
    }
  }
  pthread_cond_signal((pthread_cond_t *)&(this->super_MppMutexCond).mCondition);
  return 0;
}

Assistant:

RK_S32 mpp_list::flush()
{
    if (head) {
        while (count) {
            mpp_list_node* node = head->next;
            mpp_list_del_init(node);
            if (destroy) {
                destroy((void*)(node + 1));
            }
            free(node);
            count--;
        }
    }
    signal();
    return 0;
}